

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O1

bool __thiscall
DReachabilityPropagator::_propagateReachability(DReachabilityPropagator *this,bool local)

{
  Tint *pTVar1;
  Clause *pCVar2;
  uint uVar3;
  FilteredLT *pFVar4;
  BoolView *pBVar5;
  pointer pvVar6;
  uint *puVar7;
  int iVar8;
  ostream *poVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  anon_union_8_2_743a5d44_for_Reason_0 r;
  undefined7 in_register_00000031;
  size_t sVar13;
  int *pt;
  uint *puVar14;
  ulong uVar15;
  uint *puVar16;
  SAT *unaff_R14;
  int *pt_1;
  uint *puVar17;
  int dom_u;
  int last_incident;
  Clause *expl;
  vec<Lit> psfail;
  vector<bool,_std::allocator<bool>_> v;
  vector<bool,_std::allocator<bool>_> falsev;
  uint local_e8;
  uint local_e4;
  anon_union_8_2_743a5d44_for_Reason_0 local_e0;
  vec<Lit> local_d8;
  vector<bool,_std::allocator<bool>_> local_c0;
  vector<bool,_std::allocator<bool>_> local_98;
  undefined4 local_6c;
  vec<TrailElem> *local_68;
  uint local_5c;
  uint *local_58;
  vec<TrailElem> *local_50;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_48;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_40;
  ulong local_38;
  
  local_6c = (undefined4)CONCAT71(in_register_00000031,local);
  iVar8 = (this->in_nodes_tsize).v;
  if (iVar8 < this->in_nodes_size) {
    std::vector<int,_std::allocator<int>_>::resize(&this->in_nodes_list,(long)iVar8);
    this->in_nodes_size = (this->in_nodes_tsize).v;
  }
  (*(this->lt->super_LengauerTarjan)._vptr_LengauerTarjan[1])();
  pFVar4 = this->lt;
  (**(pFVar4->super_LengauerTarjan)._vptr_LengauerTarjan)
            (pFVar4,(ulong)(uint)(pFVar4->super_LengauerTarjan).root);
  if (this->lt->visited_innodes < (this->in_nodes_tsize).v) {
    if (so.lazy == true) {
      puVar17 = (uint *)(this->in_nodes_list).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
      uVar12 = 0xffffffff;
      for (puVar14 = (uint *)(this->in_nodes_list).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start; puVar14 != puVar17;
          puVar14 = puVar14 + 1) {
        uVar3 = *puVar14;
        iVar8 = (*(this->lt->super_LengauerTarjan)._vptr_LengauerTarjan[7])(this->lt,(ulong)uVar3);
        if ((char)iVar8 == '\0') {
          uVar12 = uVar3;
        }
      }
      local_d8.sz = 0;
      local_d8.cap = 0;
      local_d8.data = (Lit *)0x0;
      uVar3 = (this->super_GraphPropagator).vs.data[(uint)this->root].v;
      local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p._0_4_ =
           (uint)((int)sat.assigns.data[uVar3] - 1U < 0xfffffffd) + uVar3 * 2;
      vec<Lit>::push(&local_d8,(Lit *)&local_c0);
      uVar3 = (this->super_GraphPropagator).vs.data[uVar12].v;
      local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p =
           (_Bit_type *)
           CONCAT44(local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,
                    (uint)((int)sat.assigns.data[uVar3] - 1U < 0xfffffffd) + uVar3 * 2);
      vec<Lit>::push(&local_d8,(Lit *)&local_c0);
      local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p =
           (_Bit_type *)
           ((ulong)local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p &
           0xffffffffffffff00);
      std::vector<bool,_std::allocator<bool>_>::vector
                (&local_c0,(long)(int)(this->super_GraphPropagator).vs.sz,(bool *)&local_98,
                 (allocator_type *)&local_e0);
      local_e0._a = local_e0._a & 0xffffffffffffff00;
      std::vector<bool,_std::allocator<bool>_>::vector
                (&local_98,(long)(int)(this->super_GraphPropagator).vs.sz,(bool *)&local_e0,
                 (allocator_type *)&local_e8);
      reverseDFStoBorder(this,uVar12,&local_c0,&local_98,&local_d8,-1);
      uVar12 = local_d8.sz;
      uVar15 = local_d8._0_8_ & 0xffffffff;
      sVar13 = 8;
      if (local_d8.sz != 0) {
        sVar13 = (ulong)(local_d8.sz - 1) * 4 + 8;
      }
      local_e0._pt = (Clause *)malloc(sVar13);
      uVar3 = *(uint *)local_e0._pt;
      (local_e0._pt)->data[0].x = -2;
      *(uint *)local_e0._pt = uVar3 & 0xfc | uVar12 << 8;
      if (uVar12 != 0) {
        uVar11 = 0;
        do {
          (local_e0._pt)->data[uVar11].x = local_d8.data[uVar11].x;
          uVar11 = uVar11 + 1;
        } while (uVar15 != uVar11);
      }
      *(byte *)local_e0._pt = *(byte *)local_e0._pt | 2;
      vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_e0._pt);
      sat.confl = local_e0._pt;
      if (local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = 0;
        local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = 0;
        local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
      }
      if (local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = 0;
        local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = 0;
        local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
      }
      if (local_d8.data != (Lit *)0x0) {
        free(local_d8.data);
      }
    }
LAB_001d1590:
    uVar15 = 0;
  }
  else {
    if (0 < (int)(this->super_GraphPropagator).vs.sz) {
      unaff_R14 = &sat;
      local_68 = &engine.trail;
      uVar15 = 0;
      do {
        iVar8 = (*(this->lt->super_LengauerTarjan)._vptr_LengauerTarjan[7])
                          (this->lt,uVar15 & 0xffffffff);
        if (((char)iVar8 == '\0') &&
           (sat.assigns.data[(uint)(this->super_GraphPropagator).vs.data[uVar15].v] == '\0')) {
          if (so.lazy == true) {
            local_d8.sz = 0;
            local_d8.cap = 0;
            local_d8.data = (Lit *)0x0;
            vec<Lit>::push(&local_d8);
            uVar12 = (this->super_GraphPropagator).vs.data[(uint)this->root].v;
            local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p =
                 (_Bit_type *)
                 CONCAT44(local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,
                          (uint)((int)sat.assigns.data[uVar12] - 1U < 0xfffffffd) + uVar12 * 2);
            vec<Lit>::push(&local_d8,(Lit *)&local_c0);
            local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p =
                 (_Bit_type *)
                 ((ulong)local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p &
                 0xffffffffffffff00);
            std::vector<bool,_std::allocator<bool>_>::vector
                      (&local_c0,(long)(int)(this->super_GraphPropagator).vs.sz,(bool *)&local_98,
                       (allocator_type *)&local_e0);
            local_e0._a = local_e0._a & 0xffffffffffffff00;
            std::vector<bool,_std::allocator<bool>_>::vector
                      (&local_98,(long)(int)(this->super_GraphPropagator).vs.sz,(bool *)&local_e0,
                       (allocator_type *)&local_e8);
            reverseDFStoBorder(this,(int)uVar15,&local_c0,&local_98,&local_d8,-1);
            uVar12 = local_d8.sz;
            uVar11 = local_d8._0_8_ & 0xffffffff;
            sVar13 = (ulong)(local_d8.sz - 1) * 4 + 8;
            if (local_d8.sz == 0) {
              sVar13 = 8;
            }
            local_e0._pt = (Clause *)malloc(sVar13);
            uVar3 = *(uint *)local_e0._pt;
            (local_e0._pt)->data[0].x = -2;
            *(uint *)local_e0._pt = uVar3 & 0xfc | uVar12 << 8;
            if (uVar12 != 0) {
              uVar10 = 0;
              do {
                (local_e0._pt)->data[uVar10].x = local_d8.data[uVar10].x;
                uVar10 = uVar10 + 1;
              } while (uVar11 != uVar10);
            }
            *(byte *)local_e0._pt = *(byte *)local_e0._pt | 2;
            vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_e0._pt);
            r = local_e0;
            if ((Clause *)
                local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p != (Clause *)0x0) {
              operator_delete(local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
              local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
              local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_offset = 0;
              local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
              local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_offset = 0;
              local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage = (_Bit_pointer)0x0;
            }
            if ((Tint *)local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
                (Tint *)0x0) {
              operator_delete(local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
              local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
              local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_offset = 0;
              local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
              local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_offset = 0;
              local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage = (_Bit_pointer)0x0;
            }
            if (local_d8.data != (Lit *)0x0) {
              free(local_d8.data);
            }
          }
          else {
            r._pt = (Clause *)0x0;
          }
          pBVar5 = (this->super_GraphPropagator).vs.data;
          SAT::cEnqueue(&sat,(Lit)((pBVar5[uVar15].s ^ 1) + pBVar5[uVar15].v * 2),(Reason)r);
          if ((char)local_6c != '\0') {
            iVar8 = (*(this->super_GraphPropagator).super_Propagator._vptr_Propagator[0x13])
                              (this,uVar15 & 0xffffffff);
            if ((char)iVar8 == '\0') goto LAB_001d1590;
            pTVar1 = this->last_state_n + uVar15;
            local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_offset = pTVar1->v;
            local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._12_4_ = 4;
            local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)pTVar1;
            vec<TrailElem>::push(local_68,(TrailElem *)&local_c0);
            pTVar1->v = 1;
          }
        }
        uVar15 = uVar15 + 1;
      } while ((long)uVar15 < (long)(int)(this->super_GraphPropagator).vs.sz);
    }
    (*(this->lt->super_LengauerTarjan)._vptr_LengauerTarjan[3])();
    puVar14 = (uint *)(this->in_nodes_list).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
    puVar17 = (uint *)(this->in_nodes_list).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
    uVar15 = CONCAT71((int7)((ulong)unaff_R14 >> 8),puVar14 == puVar17);
    if (puVar14 != puVar17) {
      local_40 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &this->new_node;
      local_48 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &this->new_edge;
      local_38 = 0x800000000000003f;
      local_50 = &engine.trail;
      local_58 = puVar17;
      do {
        uVar12 = *puVar14;
        local_e8 = (*(this->lt->super_LengauerTarjan)._vptr_LengauerTarjan[8])
                             (this->lt,(ulong)uVar12);
        uVar11 = 0;
        if (((uVar12 != local_e8) && (local_e8 != 0xffffffff)) && (uVar12 != this->root)) {
          local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p =
               (_Bit_type *)
               ((ulong)local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p &
               0xffffffffffffff00);
          std::vector<bool,_std::allocator<bool>_>::vector
                    (&local_c0,(long)(int)(this->super_GraphPropagator).vs.sz,(bool *)&local_98,
                     (allocator_type *)&local_d8);
          uVar10 = (ulong)(int)uVar12;
          uVar11 = uVar10 + 0x3f;
          if (-1 < (long)uVar10) {
            uVar11 = uVar10;
          }
          if ((*(ulong *)((long)local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                         (((long)uVar11 >> 6) * 2 +
                         (ulong)((uVar10 & local_38) < 0x8000000000000001) * 2 + -2) * 4) >>
               (uVar10 & 0x3f) & 1) != 0) {
            poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_e8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
            poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,uVar12);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
            poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,this->root);
            local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p =
                 (_Bit_type *)
                 CONCAT71(local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._1_7_,10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_98,1);
            puVar17 = local_58;
          }
          local_e0._pt = (Clause *)0x0;
          if (sat.assigns.data[(uint)(this->super_GraphPropagator).vs.data[local_e8].v] == '\0') {
            if (so.lazy == true) {
              explain_dominator(this,uVar12,local_e8,&local_e0._pt);
            }
            pBVar5 = (this->super_GraphPropagator).vs.data;
            SAT::cEnqueue(&sat,(Lit)((uint)pBVar5[local_e8].s + pBVar5[local_e8].v * 2),
                          (Reason)local_e0);
            if ((char)local_6c == '\0') goto LAB_001d108c;
            add_innode(this,local_e8);
            iVar8 = (*(this->super_GraphPropagator).super_Propagator._vptr_Propagator[0x14])
                              (this,(ulong)local_e8);
            local_68 = (vec<TrailElem> *)CONCAT44(local_68._4_4_,1);
            if ((char)iVar8 != '\0') {
              uVar15 = uVar15 & 0xffffffff;
              pCVar2 = (Clause *)(this->last_state_n + (int)local_e8);
              local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_offset = *(uint *)pCVar2;
              local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._12_4_ = 4;
              local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)pCVar2;
              vec<TrailElem>::push(local_50,(TrailElem *)&local_98);
              puVar17 = local_58;
              *(uint *)pCVar2 = 0;
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>(local_40,(int *)&local_e8);
              goto LAB_001d108c;
            }
          }
          else {
LAB_001d108c:
            pBVar5 = (this->super_GraphPropagator).vs.data;
            local_68 = (vec<TrailElem> *)((ulong)local_68 & 0xffffffff00000000);
            if ((sat.assigns.data[(uint)pBVar5[local_e8].v] != '\0') &&
               ((uint)pBVar5[local_e8].s * -2 + 1 == (int)sat.assigns.data[(uint)pBVar5[local_e8].v]
               )) {
              local_5c = (uint)uVar15;
              local_e4 = 0xffffffff;
              local_d8.sz = 0;
              local_d8.cap = 0;
              local_d8.data = (Lit *)0x0;
              if (so.lazy == true) {
                vec<Lit>::push(&local_d8);
              }
              pvVar6 = (this->in).
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar16 = *(uint **)&pvVar6[uVar10].super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data;
              puVar7 = (uint *)pvVar6[uVar10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish;
              if (puVar16 != puVar7) {
                iVar8 = 0;
                do {
                  uVar3 = *puVar16;
                  pBVar5 = (this->super_GraphPropagator).es.data;
                  if ((sat.assigns.data[(uint)pBVar5[uVar3].v] == '\0') ||
                     ((uint)pBVar5[uVar3].s * -2 + 1 == (int)sat.assigns.data[(uint)pBVar5[uVar3].v]
                     )) {
                    iVar8 = iVar8 + 1;
                    local_e4 = uVar3;
                  }
                  else if (so.lazy == true) {
                    local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
                         (_Bit_type *)
                         CONCAT44(local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p.
                                  _4_4_,(uint)((int)sat.assigns.data[(uint)pBVar5[uVar3].v] - 1U <
                                              0xfffffffd) + pBVar5[uVar3].v * 2);
                    vec<Lit>::push(&local_d8,(Lit *)&local_98);
                  }
                  puVar17 = local_58;
                  puVar16 = puVar16 + 1;
                } while (puVar16 != puVar7);
                if ((iVar8 == 1) &&
                   (sat.assigns.data[(uint)(this->super_GraphPropagator).es.data[local_e4].v] ==
                    '\0')) {
                  if (so.lazy == true) {
                    uVar12 = (this->super_GraphPropagator).vs.data[uVar12].v;
                    local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
                         (_Bit_type *)
                         CONCAT44(local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p.
                                  _4_4_,(uint)((int)sat.assigns.data[uVar12] - 1U < 0xfffffffd) +
                                        uVar12 * 2);
                    vec<Lit>::push(&local_d8,(Lit *)&local_98);
                    uVar12 = local_d8.sz;
                    uVar15 = local_d8._0_8_ & 0xffffffff;
                    sVar13 = (ulong)(local_d8.sz - 1) * 4 + 8;
                    if (local_d8.sz == 0) {
                      sVar13 = 8;
                    }
                    local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
                         (_Bit_type *)malloc(sVar13);
                    uVar3 = *(uint *)local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                    ;
                    ((Clause *)
                    local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)->data[0].x = -2
                    ;
                    *(uint *)local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
                         uVar3 & 0xfc | uVar12 << 8;
                    if (uVar12 != 0) {
                      uVar11 = 0;
                      do {
                        ((Clause *)
                        local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)->data
                        [uVar11].x = local_d8.data[uVar11].x;
                        uVar11 = uVar11 + 1;
                      } while (uVar15 != uVar11);
                    }
                    *(byte *)local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
                         *(byte *)local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p |
                         2;
                    vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),(Clause **)&local_98);
                    local_e0._pt = (Clause *)
                                   local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                  }
                  pBVar5 = (this->super_GraphPropagator).es.data;
                  SAT::cEnqueue(&sat,(Lit)((uint)pBVar5[local_e4].s + pBVar5[local_e4].v * 2),
                                (Reason)local_e0);
                  if ((char)local_6c != '\0') {
                    iVar8 = (*(this->super_GraphPropagator).super_Propagator._vptr_Propagator[0x11])
                                      (this,(ulong)local_e4);
                    uVar15 = (ulong)local_5c;
                    if ((char)iVar8 == '\0') {
                      if (local_d8.data != (Lit *)0x0) {
                        free(local_d8.data);
                      }
                      local_68 = (vec<TrailElem> *)CONCAT44(local_68._4_4_,1);
                      goto LAB_001d136d;
                    }
                    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                    _M_insert_unique<int_const&>(local_48,(int *)&local_e4);
                    pCVar2 = (Clause *)(this->last_state_e + (int)local_e4);
                    local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset =
                         *(uint *)pCVar2;
                    local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_ = 4;
                    local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
                         (_Bit_type *)pCVar2;
                    vec<TrailElem>::push(local_50,(TrailElem *)&local_98);
                    *(uint *)pCVar2 = 0;
                  }
                }
              }
              if (local_d8.data != (Lit *)0x0) {
                free(local_d8.data);
              }
              uVar15 = (ulong)local_5c;
            }
          }
LAB_001d136d:
          if ((Tint *)local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (Tint *)0x0
             ) {
            operator_delete(local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
            local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_offset = 0;
            local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_offset = 0;
            local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_end_of_storage = (_Bit_pointer)0x0;
          }
          uVar11 = (ulong)local_68 & 0xffffffff;
        }
        if ((uVar11 & 7) != 0) break;
        puVar14 = puVar14 + 1;
        uVar15 = CONCAT71((int7)(uVar15 >> 8),puVar14 == puVar17);
      } while (puVar14 != puVar17);
    }
  }
  return (bool)((byte)uVar15 & 1);
}

Assistant:

bool DReachabilityPropagator::_propagateReachability(bool local) {
	update_innodes();
	// cout <<"PROPAGATE REACHABILITY"<<endl;
	lt->init();
	lt->LengauerTarjan::DFS();
	const int reached = lt->get_visited_innodes();
	if (DEBUG) {
		std::cout << "Reached " << reached << " in_nodes_tsize " << in_nodes_tsize
							<< " in_nodes.size() " << in_nodes_list.size() << '\n';
	}

	if (reached < in_nodes_tsize) {
		// FAIL because of not reaching some other node
		if (so.lazy) {
			int some_node = -1;
			for (const int i : in_nodes_list) {
				if (!lt->visited_dfs(i)) {
					some_node = i;
				}
			}
			assert(some_node != -1);
			vec<Lit> psfail;
			psfail.push(getNodeVar(get_root_idx()).getValLit());
			assert(getNodeVar(some_node).isFixed() && getNodeVar(some_node).isTrue());
			psfail.push(getNodeVar(some_node).getValLit());
			std::vector<bool> v(nbNodes(), false);
			std::vector<bool> falsev(nbNodes(), false);
			reverseDFStoBorder(some_node, v, falsev, psfail);
			if (DEBUG) {
				std::cout << "Expl size: " << psfail.size() << '\n';
			}
			Clause* expl = Clause_new(psfail);
			expl->temp_expl = 1;
			sat.rtrail.last().push(expl);
			sat.confl = expl;
		}
		return false;
	}
	//*
	for (int i = 0; i < nbNodes(); i++) {
		if (!lt->visited_dfs(i) && !getNodeVar(i).isFixed()) {
			Clause* r = nullptr;
			if (so.lazy) {
				vec<Lit> ps;
				ps.push();
				ps.push(getNodeVar(get_root_idx()).getValLit());
				std::vector<bool> v(nbNodes(), false);
				std::vector<bool> falsev(nbNodes(), false);
				reverseDFStoBorder(i, v, falsev, ps);
				r = Reason_new(ps);
			}
			getNodeVar(i).setVal(false, r);
			if (local) {
				if (!propagateRemNode(i)) {
					return false;
				}
				last_state_n[i] = VT_OUT;
			}
		}
	}  //*/

	lt->find_doms();
	// for (int i = 0; i < nbNodes(); i++)
	//     cerr <<"("<<i <<","<< lt->dominator(i)<<") ";
	// cerr<<endl;

	for (const int u : in_nodes_list) {
		assert(getNodeVar(u).isFixed());
		assert(getNodeVar(u).isTrue());
		if (DEBUG) {
			std::cout << "Looking at innode? u: " << u << " " << getNodeVar(u).isFixed() << '\n';
		}
		const int dom_u = lt->dominator(u);

		if (u == dom_u || dom_u == -1) {  // At the root
			continue;
		}
		if (u == get_root_idx()) {
			continue;
		}

		std::vector<bool> visited = std::vector<bool>(nbNodes(), false);
		if (DEBUG) {
			std::cout << "STARTING DFS (avoid " << dom_u << ")" << '\n';
			std::cout << "Nodes: ";
			for (int i = 0; i < nbNodes(); i++) {
				std::cout << i << "("
									<< (getNodeVar(i).isFixed() ? (getNodeVar(i).isTrue() ? "I" : "O") : "U") << "),";
			}
			std::cout << '\n';
			std::cout << "Edges: ";
			for (int i = 0; i < nbEdges(); i++) {
				std::cout << i << "[" << getTail(i) << "," << getHead(i) << "]"
									<< "(" << (getEdgeVar(i).isFixed() ? (getEdgeVar(i).isTrue() ? "I" : "O") : "U")
									<< "),";
			}
			std::cout << '\n';
		}
		assert(correctDominator(get_root_idx(), visited, dom_u));
		if (visited[u]) {
			std::cout << dom_u << " " << u << " " << get_root_idx() << '\n';
		}
		assert(!visited[u]);

		Clause* r = nullptr;

		if (!getNodeVar(dom_u).isFixed()) {
			// Fix the dominator
			//*
			if (so.lazy) {
				explain_dominator(u, dom_u, &r);
			}

			if (DEBUG) {
				std::cout << "Adding innode " << __FILE__ << __LINE__ << "(" << dom_u << " dominates " << u
									<< ")" << '\n';
			}
			getNodeVar(dom_u).setVal(true, r);
			if (local) {
				add_innode(dom_u);
				if (!propagateNewNode(dom_u)) {
					return false;
				}
				last_state_n[dom_u] = VT_IN;
				new_node.insert(dom_u);
			}
			//*/
		}

		if (getNodeVar(dom_u).isFixed() && getNodeVar(dom_u).isTrue()) {
			// Find bridge if any and enforce its endpoints
			int in_deg = 0;
			int last_incident = -1;
			vec<Lit> ps_in;
			if (so.lazy) {
				ps_in.push();
			}
			for (const int ie : in[u]) {
				if (!getEdgeVar(ie).isFixed() || getEdgeVar(ie).isTrue()) {
					in_deg++;
					last_incident = ie;
				} else if (so.lazy) {
					ps_in.push(getEdgeVar(ie).getValLit());
				}
			}
			if (in_deg == 1 && !getEdgeVar(last_incident).isFixed()) {
				//*
				if (so.lazy) {
					// ps_in.push(getNodeVar(dom_u).getValLit());
					ps_in.push(getNodeVar(u).getValLit());
					r = Reason_new(ps_in);
				}
				getEdgeVar(last_incident).setVal(true, r);
				if (local) {
					if (!propagateNewEdge(last_incident)) {
						return false;
					}
					if (DEBUG) {
						std::cout << "Adding inedge " << last_incident << " " << __FILE__ << __LINE__ << "("
											<< dom_u << " dominates " << u << ")" << '\n';
					}
					new_edge.insert(last_incident);
					last_state_e[last_incident] = VT_IN;
				}
				//*/
			}
		}
	}

	return true;
}